

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_type_set_description(coda_product_type *product_type,char *description)

{
  char *local_28;
  char *new_description;
  char *description_local;
  coda_product_type *product_type_local;
  
  local_28 = (char *)0x0;
  if (product_type->description == (char *)0x0) {
    if ((description == (char *)0x0) || (local_28 = strdup(description), local_28 != (char *)0x0)) {
      product_type->description = local_28;
      product_type_local._4_4_ = 0;
    }
    else {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                     ,0x20f);
      product_type_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-400,"product type already has a description");
    product_type_local._4_4_ = -1;
  }
  return product_type_local._4_4_;
}

Assistant:

int coda_product_type_set_description(coda_product_type *product_type, const char *description)
{
    char *new_description = NULL;

    if (product_type->description != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product type already has a description");
        return -1;
    }
    if (description != NULL)
    {
        new_description = strdup(description);
        if (new_description == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }
    product_type->description = new_description;

    return 0;
}